

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

ffs_dstring raw_to_XML_string(FMContext c,FMFormat_conflict format,void *data,int encoded)

{
  int iVar1;
  ffs_dstring ds;
  char *pcVar2;
  ffs_dstring dstr;
  
  iVar1 = FMhas_XML_info((FMFormat_conflict)c);
  ds = (ffs_dstring)ffs_malloc(0x10);
  pcVar2 = (char *)ffs_malloc(0x40);
  ds->string = pcVar2;
  *pcVar2 = '\0';
  ds->length = 0;
  ds->max_alloc = 0x40;
  if (iVar1 == 0) {
    dcatstr(ds,"<");
    dcatstr(ds,*(char **)&c->native_float_format);
    dcatstr(ds,">\n");
    if (0 < *(int *)((long)&c->server_fd + 4)) {
      iVar1 = 0;
      do {
        generic_field_to_XML((FMFormat_conflict)c,iVar1,format,format,(int)data,ds);
        iVar1 = iVar1 + 1;
      } while (iVar1 < *(int *)((long)&c->server_fd + 4));
    }
    dcatstr(ds,"</");
    dcatstr(ds,*(char **)&c->native_float_format);
    dcatstr(ds,">\n");
  }
  else {
    internal_record_to_XML_string((FMFormat_conflict)c,format,format,ds,(int)data);
  }
  return ds;
}

Assistant:

static ffs_dstring
raw_to_XML_string(FMContext c, FMFormat format, void *data, int encoded)
{
    int index;
    ffs_dstring ds;
    if (FMhas_XML_info(format)) {
	return record_to_XML_string(format, data, encoded);
    }
    ds = new_dstring();
    dcatstr(ds, "<");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    for (index = 0; index < format->field_count; index++) {
	generic_field_to_XML(format, index, data, data, 
			     encoded, ds);
    }
    dcatstr(ds, "</");
    dcatstr(ds, format->format_name);
    dcatstr(ds, ">\n");
    return ds;
}